

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

bool __thiscall RenX_ServerListPlugin::initialize(RenX_ServerListPlugin *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  Content *pCVar3;
  undefined8 uVar4;
  Content *pCVar5;
  pointer *__ptr;
  undefined1 auVar6 [16];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  Content *local_78;
  Content *local_70;
  long *local_68 [2];
  long local_58 [2];
  Content *local_48;
  Content *local_40;
  Content *local_38;
  Content *local_30;
  Content *local_28;
  
  puVar1 = &this->field_0x38;
  auVar6 = Jupiter::Config::get(puVar1,8,"Hostname",0,"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_web_hostname,0,(this->m_web_hostname)._M_string_length,auVar6._8_8_,
             auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,4,"Path",1,"/");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_web_path,0,(this->m_web_path)._M_string_length,auVar6._8_8_,auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0xf,"ServersPageName",7,"servers");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_server_list_page_name,0,(this->m_server_list_page_name)._M_string_length,
             auVar6._8_8_,auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0x14,"HumanServersPageName",0xc,"servers_long");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_server_list_long_page_name,0,
             (this->m_server_list_long_page_name)._M_string_length,auVar6._8_8_,auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0xe,"ServerPageName",6,"server");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_server_page_name,0,(this->m_server_page_name)._M_string_length,auVar6._8_8_,
             auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0x10,"MetadataPageName",8,"metadata");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_metadata_page_name,0,(this->m_metadata_page_name)._M_string_length,
             auVar6._8_8_,auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0x1a,"MetadataPrometheusPageName",0x13,"metadata_prometheus")
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_metadata_prometheus_page_name,0,
             (this->m_metadata_prometheus_page_name)._M_string_length,auVar6._8_8_,auVar6._0_8_);
  uVar4 = getHTTPServer();
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->m_server_list_page_name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (this->m_server_list_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_68,handle_server_list_page_abi_cxx11_);
  local_78 = pCVar5;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  *(undefined8 *)(local_78 + 0x40) = 2;
  *(undefined8 *)(local_78 + 0x48) = 0x111587;
  *(string_view *)(local_78 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)(local_78 + 0x60) = 5;
  *(undefined4 *)(local_78 + 100) = 0;
  *(undefined4 *)(local_78 + 0x68) = 0x11159b;
  *(undefined4 *)(local_78 + 0x6c) = 0;
  local_78[8] = (Content)0x0;
  local_28 = local_78;
  local_78 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  if (local_28 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_28,local_28);
  }
  local_28 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->m_server_list_long_page_name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,
             pcVar2 + (this->m_server_list_long_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_68,handle_server_list_long_page_abi_cxx11_);
  local_70 = pCVar5;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pCVar3 = local_70;
  pCVar5 = local_78;
  local_70 = (Content *)0x0;
  local_78 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_78,pCVar5);
  }
  if (local_70 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_70,local_70);
  }
  *(undefined8 *)(local_78 + 0x40) = 2;
  *(undefined8 *)(local_78 + 0x48) = 0x111587;
  *(string_view *)(local_78 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)(local_78 + 0x60) = 5;
  *(undefined4 *)(local_78 + 100) = 0;
  *(undefined4 *)(local_78 + 0x68) = 0x11159b;
  *(undefined4 *)(local_78 + 0x6c) = 0;
  local_78[8] = (Content)0x1;
  local_30 = local_78;
  local_78 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  if (local_30 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_30,local_30);
  }
  local_30 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->m_server_page_name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (this->m_server_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_68,handle_server_page_abi_cxx11_);
  local_70 = pCVar5;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pCVar3 = local_70;
  pCVar5 = local_78;
  local_70 = (Content *)0x0;
  local_78 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_78,pCVar5);
  }
  if (local_70 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_70,local_70);
  }
  *(undefined8 *)(local_78 + 0x40) = 2;
  *(undefined8 *)(local_78 + 0x48) = 0x111587;
  *(string_view *)(local_78 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)(local_78 + 0x60) = 5;
  *(undefined4 *)(local_78 + 100) = 0;
  *(undefined4 *)(local_78 + 0x68) = 0x11159b;
  *(undefined4 *)(local_78 + 0x6c) = 0;
  local_78[8] = (Content)0x1;
  local_38 = local_78;
  local_78 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  if (local_38 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_38,local_38);
  }
  local_38 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->m_metadata_page_name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (this->m_metadata_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_68,handle_metadata_page_abi_cxx11_);
  local_70 = pCVar5;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pCVar3 = local_70;
  pCVar5 = local_78;
  local_70 = (Content *)0x0;
  local_78 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_78,pCVar5);
  }
  if (local_70 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_70,local_70);
  }
  *(undefined8 *)(local_78 + 0x40) = 2;
  *(undefined8 *)(local_78 + 0x48) = 0x111587;
  *(string_view *)(local_78 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)(local_78 + 0x60) = 5;
  *(undefined4 *)(local_78 + 100) = 0;
  *(undefined4 *)(local_78 + 0x68) = 0x11159b;
  *(undefined4 *)(local_78 + 0x6c) = 0;
  local_78[8] = (Content)0x0;
  local_40 = local_78;
  local_78 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  if (local_40 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_40,local_40);
  }
  local_40 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->m_metadata_prometheus_page_name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,
             pcVar2 + (this->m_metadata_prometheus_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content
            (pCVar5,local_68,handle_metadata_prometheus_page_abi_cxx11_);
  local_70 = pCVar5;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pCVar3 = local_70;
  pCVar5 = local_78;
  local_70 = (Content *)0x0;
  local_78 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_78,pCVar5);
  }
  if (local_70 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_70,local_70);
  }
  *(undefined8 *)(local_78 + 0x40) = 2;
  *(undefined8 *)(local_78 + 0x48) = 0x111587;
  *(string_view *)(local_78 + 0x50) = CONTENT_TYPE_APPLICATION_JSON;
  *(undefined4 *)(local_78 + 0x60) = 5;
  *(undefined4 *)(local_78 + 100) = 0;
  *(undefined4 *)(local_78 + 0x68) = 0x11159b;
  *(undefined4 *)(local_78 + 0x6c) = 0;
  local_78[8] = (Content)0x0;
  local_48 = local_78;
  local_78 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->m_web_hostname)._M_string_length,(this->m_web_hostname)._M_dataplus._M_p,
             (this->m_web_path)._M_string_length,(this->m_web_path)._M_dataplus._M_p);
  if (local_48 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_48,local_48);
  }
  local_48 = (Content *)0x0;
  updateServerList(this);
  if (local_78 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_78,local_78);
  }
  return true;
}

Assistant:

bool RenX_ServerListPlugin::initialize() {
	m_web_hostname = this->config.get("Hostname"sv, ""sv);
	m_web_path = this->config.get("Path"sv, "/"sv);
	m_server_list_page_name = this->config.get("ServersPageName"sv, "servers"sv);
	m_server_list_long_page_name = this->config.get("HumanServersPageName"sv, "servers_long"sv);
	m_server_page_name = this->config.get("ServerPageName"sv, "server"sv);
	m_metadata_page_name = this->config.get("MetadataPageName"sv, "metadata"sv);
	m_metadata_prometheus_page_name = this->config.get("MetadataPrometheusPageName"sv, "metadata_prometheus"sv);

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	// Server list page
	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_page_name, handle_server_list_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server list (long) page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_list_long_page_name, handle_server_list_long_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Server page (GUIDs)
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_server_page_name, handle_server_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = true;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_page_name, handle_metadata_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	// Metadata page
	content = std::make_unique<Jupiter::HTTP::Server::Content>(m_metadata_prometheus_page_name, handle_metadata_prometheus_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = CONTENT_TYPE_APPLICATION_JSON;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	content->free_result = false;
	server.hook(m_web_hostname, m_web_path, std::move(content));

	this->updateServerList();
	return true;
}